

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syncprod.cc
# Opt level: O2

void __thiscall tchecker::syncprod::syncprod_t::build(syncprod_t *this)

{
  state_status_t in_ECX;
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
  *in_RDX;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RSI;
  
  build((syncprod_t *)
        ((long)&this[-1]._transition_allocator.
                super_transition_pool_allocator_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>
                ._vedge_pool._collectables.
                super__Vector_base<std::shared_ptr<tchecker::collectable_t>,_std::allocator<std::shared_ptr<tchecker::collectable_t>_>_>
                ._M_impl.super__Vector_impl_data + 8),in_RSI,in_RDX,in_ECX);
  return;
}

Assistant:

void syncprod_t::build(std::map<std::string, std::string> const & attributes, std::vector<sst_t> & v,
                       tchecker::state_status_t mask)
{
  tchecker::syncprod::state_sptr_t s = _state_allocator.construct();
  tchecker::syncprod::transition_sptr_t t = _transition_allocator.construct();
  tchecker::state_status_t status = tchecker::syncprod::initialize(*_system, *s, *t, attributes);
  if (status & mask) {
    if (_sharing_type == tchecker::ts::SHARING) {
      share(s);
      share(t);
    }
    v.push_back(std::make_tuple(status, s, t));
  }
}